

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event.cpp
# Opt level: O3

void __thiscall cppnet::TimerEvent::OnTimer(TimerEvent *this)

{
  OnTimer((TimerEvent *)&this[-1]._timer_id);
  return;
}

Assistant:

void TimerEvent::OnTimer() {
    if (GetType() & ET_USER_TIMER) {
        _timer_cb(GetData());

    } else if (GetType() & ET_TIMER) {
        auto sock = GetSocket();
        auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
        rw_sock->OnTimer();

    } else {
        LOG_ERROR("invalid timer type. type:%d", GetType());
    }
}